

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_inspect(REF_GEOM ref_geom)

{
  int iVar1;
  REF_INT *pRVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  printf("ref_geom = %p\n",ref_geom);
  printf(" n = %d, max = %d\n",(ulong)(uint)ref_geom->n,(ulong)(uint)ref_geom->max);
  if (0 < ref_geom->max) {
    lVar3 = 0x14;
    lVar5 = 0;
    uVar4 = 0;
    do {
      pRVar2 = ref_geom->descr;
      iVar1 = *(int *)((long)pRVar2 + lVar3 + -0x14);
      if (iVar1 == 2) {
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               *(undefined8 *)((long)ref_geom->param + lVar5),
               *(undefined8 *)((long)ref_geom->param + lVar5 + 8),uVar4 & 0xffffffff,
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -0x10),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -8),(ulong)*(uint *)((long)pRVar2 + lVar3),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -4));
      }
      else if (iVar1 == 1) {
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",
               *(undefined8 *)((long)ref_geom->param + lVar5),uVar4 & 0xffffffff,
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -0x10),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -8),(ulong)*(uint *)((long)pRVar2 + lVar3),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -4));
      }
      else if (iVar1 == 0) {
        printf("%d node: %d id, %d jump, %d degen, %d global\n",uVar4 & 0xffffffff,
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -0x10),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -8),
               (ulong)*(uint *)((long)pRVar2 + lVar3 + -4),(ulong)*(uint *)((long)pRVar2 + lVar3));
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
      lVar3 = lVar3 + 0x18;
    } while ((long)uVar4 < (long)ref_geom->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_inspect(REF_GEOM ref_geom) {
  REF_INT geom;
  printf("ref_geom = %p\n", (void *)ref_geom);
  printf(" n = %d, max = %d\n", ref_geom_n(ref_geom), ref_geom_max(ref_geom));
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_node(ref_geom, geom), ref_geom_degen(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_node(ref_geom, geom), ref_geom_degen(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}